

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O1

void inproc_pipe_close(void *arg)

{
  nni_mtx *mtx;
  long lVar1;
  
  mtx = (nni_mtx *)(*(long *)((long)arg + 8) + 0x48);
  lVar1 = 1;
  do {
    nni_mtx_lock(mtx);
    mtx[1].mtx.__size[0] = '\x01';
    inproc_queue_run_closed((inproc_queue *)&mtx[-2].mtx.__data.__list.__next);
    nni_mtx_unlock(mtx);
    mtx = (nni_mtx *)((long)&mtx[2].mtx + 0x10);
    lVar1 = lVar1 + -1;
  } while (lVar1 == 0);
  return;
}

Assistant:

static void
inproc_pipe_close(void *arg)
{
	inproc_pipe *pipe = arg;
	inproc_pair *pair = pipe->pair;

	for (int i = 0; i < 2; i++) {
		inproc_queue *queue = &pair->queues[i];
		nni_mtx_lock(&queue->lock);
		queue->closed = true;
		inproc_queue_run_closed(queue);
		nni_mtx_unlock(&queue->lock);
	}
}